

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::copytexsubimage2d_invalid_offset
               (NegativeTestContext *ctx)

{
  NegativeTestContext *this;
  allocator<char> local_39;
  string local_38;
  GLuint local_14;
  NegativeTestContext *pNStack_10;
  GLuint texture;
  NegativeTestContext *ctx_local;
  
  local_14 = 0x1234;
  pNStack_10 = ctx;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&local_14);
  glu::CallLogWrapper::glBindTexture(&pNStack_10->super_CallLogWrapper,0xde1,local_14);
  glu::CallLogWrapper::glTexImage2D
            (&pNStack_10->super_CallLogWrapper,0xde1,0,0x1908,0x10,0x10,0,0x1908,0x1401,(void *)0x0)
  ;
  this = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if xoffset + width > texture_width or yoffset + height > texture_height."
             ,&local_39);
  NegativeTestContext::beginSection(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glCopyTexSubImage2D(&pNStack_10->super_CallLogWrapper,0xde1,0,0xe,0,0,0,4,4);
  NegativeTestContext::expectError(pNStack_10,0x501);
  glu::CallLogWrapper::glCopyTexSubImage2D(&pNStack_10->super_CallLogWrapper,0xde1,0,0,0xe,0,0,4,4);
  NegativeTestContext::expectError(pNStack_10,0x501);
  glu::CallLogWrapper::glCopyTexSubImage2D
            (&pNStack_10->super_CallLogWrapper,0xde1,0,0xe,0xe,0,0,4,4);
  NegativeTestContext::expectError(pNStack_10,0x501);
  NegativeTestContext::endSection(pNStack_10);
  glu::CallLogWrapper::glDeleteTextures(&pNStack_10->super_CallLogWrapper,1,&local_14);
  return;
}

Assistant:

void copytexsubimage2d_invalid_offset (NegativeTestContext& ctx)
{
	GLuint texture = 0x1234;
	ctx.glGenTextures	(1, &texture);
	ctx.glBindTexture	(GL_TEXTURE_2D, texture);
	ctx.glTexImage2D	(GL_TEXTURE_2D, 0, GL_RGBA, 16, 16, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);

	ctx.beginSection("GL_INVALID_VALUE is generated if xoffset + width > texture_width or yoffset + height > texture_height.");
	ctx.glCopyTexSubImage2D(GL_TEXTURE_2D, 0, 14, 0, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexSubImage2D(GL_TEXTURE_2D, 0, 0, 14, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexSubImage2D(GL_TEXTURE_2D, 0, 14, 14, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteTextures(1, &texture);
}